

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O3

DdNode * Cudd_zddDivideF(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddDivideF(dd,f,g);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode  *
Cudd_zddDivideF(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode      *res;

    do {
        dd->reordered = 0;
        res = cuddZddDivideF(dd, f, g);
    } while (dd->reordered == 1);
    return(res);

}